

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O1

int rtr_handle_error_pdu(rtr_socket *rtr_socket,void *buf)

{
  byte bVar1;
  long lVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  ulong uVar3;
  rtr_socket_state new_state;
  ulong uVar4;
  char *frmt;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  lrtr_dbg("RTR Socket: Error PDU received");
  switch(*(undefined2 *)((long)buf + 2)) {
  case 0:
    frmt = "RTR Socket: Corrupt data received";
    break;
  case 1:
    frmt = "RTR Socket: Internal error on server-side";
    break;
  case 2:
    lrtr_dbg("RTR Socket: No data available");
    new_state = RTR_ERROR_NO_DATA_AVAIL;
    goto LAB_00109acf;
  case 3:
    frmt = "RTR Socket: Invalid request from client";
    break;
  case 4:
    lrtr_dbg("RTR Socket: Client uses unsupported protocol version");
    bVar1 = *buf;
    if ((bVar1 < 3) && ((uint)bVar1 <= rtr_socket->version && rtr_socket->version != (uint)bVar1)) {
      lrtr_dbg("RTR Socket: Downgrading from %i to version %i");
      rtr_socket->version = (uint)*buf;
      new_state = RTR_FAST_RECONNECT;
      goto LAB_00109acf;
    }
    lrtr_dbg("RTR Socket: Got UNSUPPORTED_PROTOCOL_VER error PDU with invalid values, current version:%i, PDU version:%i"
             ,(ulong)rtr_socket->version);
    goto LAB_00109aca;
  case 5:
    frmt = "RTR Socket: Client set unsupported PDU type";
    break;
  default:
    lrtr_dbg("RTR Socket: error unknown, server sent unsupported error code %u");
    goto LAB_00109aca;
  }
  lrtr_dbg(frmt);
LAB_00109aca:
  new_state = RTR_ERROR_FATAL;
LAB_00109acf:
  rtr_change_socket_state(rtr_socket,new_state);
  uVar3 = (ulong)*(uint *)((long)buf + 8);
  uVar4 = (ulong)*(uint *)((long)buf + uVar3 + 0xc);
  if (uVar4 == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  else if (uVar3 + uVar4 + 0x10 == (ulong)*(uint *)((long)buf + 4)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
      lrtr_dbg("RTR Socket: Error PDU included the following error msg: \'%.*s\'",uVar4,
               (long)buf + uVar3 + 0x10);
      return extraout_EAX;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    lrtr_dbg("RTR Socket: error: Length of error text contains an incorrect value");
    return extraout_EAX_00;
  }
  __stack_chk_fail();
}

Assistant:

static int rtr_handle_error_pdu(struct rtr_socket *rtr_socket, const void *buf)
{
	RTR_DBG1("Error PDU received"); // TODO: append server ip & port
	const struct pdu_error *pdu = buf;

	switch (pdu->error_code) {
	case CORRUPT_DATA:
		RTR_DBG1("Corrupt data received");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	case INTERNAL_ERROR:
		RTR_DBG1("Internal error on server-side");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	case NO_DATA_AVAIL:
		RTR_DBG1("No data available");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_NO_DATA_AVAIL);
		break;
	case INVALID_REQUEST:
		RTR_DBG1("Invalid request from client");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	case UNSUPPORTED_PROTOCOL_VER:
		RTR_DBG1("Client uses unsupported protocol version");
		if (pdu->ver <= RTR_PROTOCOL_MAX_SUPPORTED_VERSION && pdu->ver >= RTR_PROTOCOL_MIN_SUPPORTED_VERSION &&
		    pdu->ver < rtr_socket->version) {
			RTR_DBG("Downgrading from %i to version %i", rtr_socket->version, pdu->ver);
			rtr_socket->version = pdu->ver;
			rtr_change_socket_state(rtr_socket, RTR_FAST_RECONNECT);
		} else {
			RTR_DBG("Got UNSUPPORTED_PROTOCOL_VER error PDU with invalid values, current version:%i, PDU version:%i",
				rtr_socket->version, pdu->ver);
			rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		}
		break;
	case UNSUPPORTED_PDU_TYPE:
		RTR_DBG1("Client set unsupported PDU type");
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	default:
		RTR_DBG("error unknown, server sent unsupported error code %u", pdu->error_code);
		rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
		break;
	}

	const uint32_t len_err_txt = *((uint32_t *)(pdu->rest + pdu->len_enc_pdu));

	if (len_err_txt > 0) {
		if ((sizeof(pdu->ver) + sizeof(pdu->type) + sizeof(pdu->error_code) + sizeof(pdu->len) +
		     sizeof(pdu->len_enc_pdu) + pdu->len_enc_pdu + 4 + len_err_txt) != pdu->len) {
			RTR_DBG1("error: Length of error text contains an incorrect value");
		} else {
			char *pdu_txt = (char *)pdu->rest + pdu->len_enc_pdu + sizeof(len_err_txt);

			RTR_DBG("Error PDU included the following error msg: \'%.*s\'", len_err_txt, pdu_txt);
		}
	}

	return RTR_SUCCESS;
}